

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QSize __thiscall QAbstractSpinBox::minimumSizeHint(QAbstractSpinBox *this)

{
  bool bVar1;
  QAbstractSpinBoxPrivate *pQVar2;
  int *piVar3;
  qsizetype qVar4;
  QStyle *pQVar5;
  QSize QVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar7;
  int h;
  QAbstractSpinBoxPrivate *d;
  QSize hint;
  QString fixedContent;
  QString s;
  int w;
  QFontMetrics fm;
  QStyleOptionSpinBox opt;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QSize *in_stack_fffffffffffffea0;
  QString *a;
  QWidget *this_00;
  undefined1 *local_128;
  int local_120;
  int local_11c;
  undefined1 local_118 [28];
  int local_fc;
  undefined1 local_f8 [24];
  QString *local_e0;
  char16_t local_d8;
  undefined2 local_ca;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QString *local_b8;
  QString local_a8;
  int local_8c;
  undefined8 local_88;
  undefined1 *local_80;
  QSize local_78;
  undefined1 local_70 [88];
  QString *local_18;
  char16_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QAbstractSpinBox *)0x687fe0);
  bVar1 = QSize::isEmpty((QSize *)in_RDI);
  if (bVar1) {
    QWidget::ensurePolished(this_00);
    a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_88 = (**(code **)(*(long *)&pQVar2->edit->super_QWidget + 0x78))();
    QSize::height((QSize *)0x68805c);
    local_8c = 0;
    local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.size = (qsizetype)a;
    QString::QString((QString *)0x688096);
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_ca = 0x20;
    local_b8 = a;
    QVar7 = ::operator+(a,(char16_t *)in_stack_fffffffffffffea0);
    local_e0 = QVar7.a;
    local_d8 = QVar7.b;
    local_18 = local_e0;
    local_10 = local_d8;
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_char16_t> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    (**(code **)(*(long *)&pQVar2->super_QWidgetPrivate + 0xd8))(local_f8,pQVar2,&pQVar2->minimum);
    QString::operator=((QString *)in_stack_fffffffffffffea0,
                       (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QString::~QString((QString *)0x688155);
    QString::truncate((longlong)&local_a8);
    QString::operator+=((QString *)in_stack_fffffffffffffea0,
                        (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_fc = QFontMetrics::horizontalAdvance((QString *)&local_80,(int)&local_a8);
    piVar3 = qMax<int>(&local_8c,&local_fc);
    local_8c = *piVar3;
    (**(code **)(*(long *)&pQVar2->super_QWidgetPrivate + 0xd8))(local_118,pQVar2,&pQVar2->maximum);
    QString::operator=((QString *)in_stack_fffffffffffffea0,
                       (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QString::~QString((QString *)0x6881f0);
    QString::truncate((longlong)&local_a8);
    QString::operator+=((QString *)in_stack_fffffffffffffea0,
                        (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_11c = QFontMetrics::horizontalAdvance((QString *)&local_80,(int)&local_a8);
    piVar3 = qMax<int>(&local_8c,&local_11c);
    local_8c = *piVar3;
    qVar4 = QString::size(&pQVar2->specialValueText);
    if (qVar4 != 0) {
      QString::operator=(&local_a8,(QString *)&pQVar2->specialValueText);
      local_120 = QFontMetrics::horizontalAdvance((QString *)&local_80,(int)&local_a8);
      piVar3 = qMax<int>(&local_8c,&local_120);
      local_8c = *piVar3;
    }
    local_8c = local_8c + 2;
    memset(local_70,0xaa,0x58);
    QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)0x6882ee);
    (**(code **)((long)*(QSize *)in_RDI + 0x1c0))(in_RDI,local_70);
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                           );
    QVar6 = (QSize)(**(code **)(*(long *)pQVar5 + 0xe8))(pQVar5,0xf,local_70,&local_128,in_RDI);
    pQVar2->cachedMinimumSizeHint = QVar6;
    QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x688375);
    QString::~QString((QString *)0x688382);
    QString::~QString((QString *)0x68838f);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_80);
  }
  local_78 = pQVar2->cachedMinimumSizeHint;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_78;
}

Assistant:

QSize QAbstractSpinBox::minimumSizeHint() const
{
    Q_D(const QAbstractSpinBox);
    if (d->cachedMinimumSizeHint.isEmpty()) {
        //Use the prefix and range to calculate the minimumSizeHint
        ensurePolished();

        const QFontMetrics fm(fontMetrics());
        int h = d->edit->minimumSizeHint().height();
        int w = 0;

        QString s;
        QString fixedContent =  d->prefix + u' ';
        s = d->textFromValue(d->minimum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));
        s = d->textFromValue(d->maximum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));

        if (d->specialValueText.size()) {
            s = d->specialValueText;
            w = qMax(w, fm.horizontalAdvance(s));
        }
        w += 2; // cursor blinking space

        QStyleOptionSpinBox opt;
        initStyleOption(&opt);
        QSize hint(w, h);

        d->cachedMinimumSizeHint = style()->sizeFromContents(QStyle::CT_SpinBox, &opt, hint, this);
    }
    return d->cachedMinimumSizeHint;
}